

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O3

void Sfm_ObjSetdownSimInfo(Abc_Obj_t *pObj)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  ulong uVar8;
  long lVar9;
  ulong *puVar10;
  ulong uVar11;
  uint local_48 [2];
  ulong local_40;
  ulong local_38;
  
  if ((*(int *)&pObj->pNtk->vLtlProperties != 0) &&
     (local_40 = (ulong)*(int *)&pObj[2].pNext, 0 < (long)local_40)) {
    uVar4 = pObj[3].vFanouts.nSize;
    uVar8 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar8;
    }
    do {
      if (uVar8 == uVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = pObj[3].vFanouts.pArray[uVar8];
      lVar6 = (long)iVar1;
      if ((lVar6 < 0) || (*(int *)((long)&pObj[4].vFanins.pArray + 4) <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                      ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      lVar2 = *(long *)&pObj[4].vFanouts;
      uVar11 = *(ulong *)(lVar2 + lVar6 * 8);
      lVar9 = 0;
      puVar10 = (ulong *)local_48;
      bVar3 = true;
      do {
        bVar7 = bVar3;
        uVar4 = (&pObj[6].vFanouts.nCap)[lVar9];
        if (0x1f < (int)uVar4) {
          uVar4 = 0x20;
        }
        if (0x40 < uVar4) {
          __assert_fail("nBits >= 0 && nBits <= 64",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                        ,0xc2,"word Abc_Tt6Mask(int)");
        }
        if ((long)*(int *)((long)&pObj[6].pNext + lVar9 * 0x10 + 4) <= (long)(uVar8 * 8)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                        ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        *puVar10 = ((*(ulong *)(*(long *)(&pObj[6].Id + lVar9 * 4) + uVar8 * 0x40) ^ uVar11) <<
                   (-(char)uVar4 & 0x3fU)) >> (-(char)uVar4 & 0x3fU) ^ uVar11;
        uVar11 = uVar11 >> 0x20;
        lVar9 = 1;
        puVar10 = &local_38;
        bVar3 = false;
      } while (bVar7);
      *(ulong *)(lVar2 + lVar6 * 8) = local_38 << 0x20 | (ulong)local_48[0];
      uVar8 = uVar8 + 1;
    } while (uVar8 != local_40);
  }
  return;
}

Assistant:

static inline void Sfm_ObjSetdownSimInfo( Abc_Obj_t * pObj )
{
    int nPatKeep = 32;
    Sfm_Dec_t * p = Sfm_DecMan( pObj );
    int c, d; word uSim, uSims[2], uMask;
    if ( !p->pPars->fUseSim )
        return;
    for ( d = 0; d < p->nDivs; d++ )
    {
        uSim = Vec_WrdEntry( &p->vObjSims, Vec_IntEntry(&p->vObjMap, d) );
        for ( c = 0; c < 2; c++ )
        {
            uMask = Abc_Tt6Mask( Abc_MinInt(p->nPats[c], nPatKeep) );
            uSims[c] = (Sfm_DecDivPats(p, d, c)[0] & uMask) | (uSim & ~uMask);
            uSim >>= 32;
        }
        uSim = (uSims[0] & 0xFFFFFFFF) | (uSims[1] << 32);
        Vec_WrdWriteEntry( &p->vObjSims, Vec_IntEntry(&p->vObjMap, d), uSim );
    }
}